

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O2

bool markChildEdge(args *t,stateRecord *state,bool which)

{
  Mode MVar1;
  __pointer_type pnVar2;
  node *parent;
  seekRecord *psVar3;
  undefined7 in_register_00000011;
  node *oldChild;
  ulong which_00;
  edge helpeeEdge;
  edge local_68;
  edge local_48;
  
  MVar1 = state->mode;
  psVar3 = &state->successorRecord;
  if (MVar1 == INJECTION) {
    psVar3 = (seekRecord *)&state->targetEdge;
  }
  local_68.parent = (psVar3->lastEdge).parent;
  parent = (psVar3->lastEdge).child;
  local_68.which = (psVar3->lastEdge).which;
  local_68._17_7_ = *(undefined7 *)&(psVar3->lastEdge).field_0x11;
  which_00 = CONCAT71(in_register_00000011,which) & 0xffffffff;
  local_68.child = parent;
  while( true ) {
    pnVar2 = parent->child[which_00]._M_b._M_p;
    if (((ulong)pnVar2 & 4) == 0) break;
    local_48.parent = parent;
    local_48.child = (node *)((ulong)pnVar2 & 0xfffffffffffffff0);
    local_48.which = which;
    helpTargetNode(t,&local_48,state->depth + 1);
  }
  if (((ulong)pnVar2 & 2) == 0) {
    if (((ulong)pnVar2 & 1) == 0) {
      oldChild = (node *)((ulong)pnVar2 | 8);
      if (((ulong)pnVar2 & 8) == 0) {
        oldChild = (node *)((ulong)pnVar2 & 0xfffffffffffffff0);
      }
      CAS(parent,which_00,oldChild,
          (node *)((long)oldChild->child + ((ulong)(MVar1 == INJECTION) - 7)));
    }
    if (MVar1 != INJECTION) {
      return true;
    }
    helpSuccessorNode(t,&local_68,state->depth + 1);
  }
  else {
    if (MVar1 == INJECTION) {
      return true;
    }
    helpTargetNode(t,&local_68,state->depth + 1);
  }
  return false;
}

Assistant:

bool markChildEdge(struct args* t, struct stateRecord* state, bool which)
{
    struct node* node;
    struct edge edge;
    Flag flag;
    struct node* address;
    struct node* temp;
    bool n,i,d,p,result;
    struct edge helpeeEdge;
    struct node* oldValue;
    struct node* newValue;

    if(state->mode == INJECTION)
    {
        edge = state->targetEdge;
        flag = DELETE_FLAG;
    }
    else
    {
        edge = state->successorRecord.lastEdge;
        flag = PROMOTE_FLAG;
    }

    node = edge.child;

    while(true)
    {
        temp = node->child[which];
        n=isNull(temp);
        i=IFlagSet(temp);
        d=DFlagSet(temp);
        p=PFlagSet(temp);
        address=getAddress(temp);
        if(i)
        {
            fillTheEdge(&helpeeEdge,node,address,which);
            helpTargetNode(t,&helpeeEdge,state->depth+1);
            continue;
        }
        else if(d)
        {
            if(flag == PROMOTE_FLAG)
            {
                helpTargetNode(t,&edge,state->depth+1);
                return false;
            }
            else
            {
                return true;
            }
        }
        else if(p)
        {
            if(flag == DELETE_FLAG)
            {
                helpSuccessorNode(t,&edge,state->depth+1);
                return false;
            }
            else
            {
                return true;
            }
        }

        if(n)
        {
            oldValue = setNull(address);
        }
        else
        {
            oldValue = address;
        }

        if(flag == DELETE_FLAG)
        {
            newValue = setDFlag(oldValue);
        }
        else
        {
            newValue = setPFlag(oldValue);
        }
        result = CAS(node,which,oldValue,newValue);
        if(result)
        {
            break;
        }
    }
    return true;
}